

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::ArrayPtr<char_const>,kj::ArrayPtr<char>,kj::StringPtr>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<const_char> *params,
          ArrayPtr<char> *params_1,StringPtr *params_2)

{
  ArrayPtr<const_char> *value;
  ArrayPtr<char> *value_00;
  StringPtr *value_01;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  ArrayPtr<char> *local_28;
  StringPtr *params_local_2;
  ArrayPtr<char> *params_local_1;
  ArrayPtr<const_char> *params_local;
  
  local_28 = params_1;
  params_local_2 = (StringPtr *)params;
  params_local_1 = (ArrayPtr<char> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  value = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)this);
  local_38 = toCharSequence<kj::ArrayPtr<char_const>>(value);
  value_00 = fwd<kj::ArrayPtr<char>>((NoInfer<kj::ArrayPtr<char>_> *)params_local_2);
  local_48 = toCharSequence<kj::ArrayPtr<char>>(value_00);
  value_01 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)local_28);
  local_58 = toCharSequence<kj::StringPtr>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,&local_58,&params_2->content);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}